

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcRelDefinesByProperties::IfcRelDefinesByProperties
          (IfcRelDefinesByProperties *this,void **vtt)

{
  void **vtt_local;
  IfcRelDefinesByProperties *this_local;
  
  IfcRelDefines::IfcRelDefines(&this->super_IfcRelDefines,vtt + 1);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDefinesByProperties,_1UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDefinesByProperties,_1UL> *)
             &(this->super_IfcRelDefines).field_0xc0,vtt + 0x10);
  *(void **)&this->super_IfcRelDefines = *vtt;
  *(void **)(&(this->super_IfcRelDefines).field_0x0 +
            *(long *)(*(long *)&this->super_IfcRelDefines + -0x18)) = vtt[0x12];
  *(void **)&(this->super_IfcRelDefines).field_0x88 = vtt[0x13];
  (this->super_IfcRelDefines).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDefines,_1UL>.
  _vptr_ObjectHelper = (_func_int **)vtt[0x14];
  *(void **)&(this->super_IfcRelDefines).field_0xc0 = vtt[0x15];
  STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>::Lazy
            ((Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition> *)
             &(this->super_IfcRelDefines).field_0xd0,(LazyObject *)0x0);
  return;
}

Assistant:

IfcRelDefinesByProperties() : Object("IfcRelDefinesByProperties") {}